

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O2

void __thiscall xLearn::PARSER_TEST_Parse_libffm_Test::TestBody(PARSER_TEST_Parse_libffm_Test *this)

{
  uint64 size;
  allocator local_c9;
  char *buffer;
  FFMParser parser;
  string local_90 [32];
  DMatrix matrix;
  
  write_data((string *)&Kfilename_abi_cxx11_,(string *)kStrFFM_abi_cxx11_);
  buffer = (char *)0x0;
  size = ReadFileToMemory((string *)&Kfilename_abi_cxx11_,&buffer);
  DMatrix::DMatrix(&matrix);
  parser.super_Parser.splitor_._M_dataplus._M_p = (pointer)&parser.super_Parser.splitor_.field_2;
  parser.super_Parser.splitor_._M_string_length = 0;
  parser.super_Parser.splitor_.field_2._M_local_buf[0] = '\0';
  parser.super_Parser._vptr_Parser = (_func_int **)&PTR__Parser_00154430;
  parser.super_Parser.has_label_ = true;
  std::__cxx11::string::string(local_90," ",&local_c9);
  std::__cxx11::string::_M_assign((string *)&parser.super_Parser.splitor_);
  std::__cxx11::string::~string(local_90);
  FFMParser::Parse(&parser,buffer,size,&matrix,true);
  check(&matrix,true,true);
  FFMParser::Parse(&parser,buffer,size,&matrix,false);
  check_double(&matrix,true,true);
  FFMParser::Parse(&parser,buffer,size,&matrix,true);
  check(&matrix,true,true);
  RemoveFile(Kfilename_abi_cxx11_);
  Parser::~Parser(&parser.super_Parser);
  DMatrix::~DMatrix(&matrix);
  return;
}

Assistant:

TEST(PARSER_TEST, Parse_libffm) {
  write_data(Kfilename, kStrFFM);
  char* buffer = nullptr;
  uint64 size = ReadFileToMemory(Kfilename, &buffer);
  DMatrix matrix;
  FFMParser parser;
  parser.setLabel(true);
  parser.setSplitor(" ");
  parser.Parse(buffer, size, matrix, true);
  check(matrix, true, true);
  parser.Parse(buffer, size, matrix, false);
  check_double(matrix, true, true);
  parser.Parse(buffer, size, matrix, true);
  check(matrix, true, true);
  RemoveFile(Kfilename.c_str());
}